

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char * make_import(char *prefix,char *mod,char *suffix)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  
  cVar1 = *mod;
  sVar2 = strlen(prefix);
  sVar3 = strlen(mod + (cVar1 == '('));
  sVar4 = strlen(suffix);
  sVar2 = sVar3 + sVar2 + sVar4 + 1;
  __s = (char *)malloc(sVar2);
  snprintf(__s,sVar2,"%s%s%s",prefix,mod + (cVar1 == '('),suffix);
  pcVar5 = __s;
  do {
    if (*pcVar5 == '.') {
      *pcVar5 = ' ';
    }
    else if (*pcVar5 == '\0') {
      return __s;
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static char* make_import(const char* prefix, const char* mod, const char* suffix) {
  char *impmod, *p;
  size_t impmodsize;
  if (mod[0] == '(') mod++;
  impmodsize = strlen(prefix) + strlen(mod) + strlen(suffix) + 1;
  impmod = (char*) malloc(impmodsize);
  snprintf(impmod, impmodsize, "%s%s%s", prefix, mod, suffix);
  for (p=impmod; *p; p++)
    if (*p == '.') *p=' ';
  return impmod;
}